

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<long> __thiscall
kj::anon_unknown_55::tryParseInteger<long>(anon_unknown_55 *this,StringPtr *s)

{
  anon_union_8_1_a8c68091_for_NullableValue<long>_2 extraout_RDX;
  Maybe<long> MVar1;
  Maybe<long_long> local_38;
  long local_28;
  longlong max;
  longlong min;
  StringPtr *s_local;
  
  min = (longlong)s;
  s_local = (StringPtr *)this;
  max = MinValue_::operator_cast_to_long((MinValue_ *)&minValue);
  local_28 = MaxValue_::operator_cast_to_long((MaxValue_ *)&maxValue);
  tryParseSigned((anon_unknown_55 *)&local_38,(StringPtr *)min,max,local_28);
  Maybe<long>::Maybe<long_long>((Maybe<long> *)this,&local_38);
  Maybe<long_long>::~Maybe(&local_38);
  MVar1.ptr.field_1.value = extraout_RDX.value;
  MVar1.ptr._0_8_ = this;
  return (Maybe<long>)MVar1.ptr;
}

Assistant:

Maybe<T> tryParseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseUnsigned(s, max));
  }
}